

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void run<ANSint>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *input_name)

{
  uint32_t *puVar1;
  pointer puVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  long lVar5;
  size_t __new_size;
  long lVar6;
  long lVar7;
  size_t n;
  size_type __n;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 in_XMM4 [16];
  pair<double,_unsigned_long> pVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> recover;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  unsigned_long local_a0;
  string *local_98;
  double local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  undefined4 *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  string local_50;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar8 [16];
  
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVar11 = compute_entropy(puVar1,(long)(input->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1
                                  >> 2);
  local_90 = pVar11.first;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_f0,
             ((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start) * 2,(allocator_type *)&local_70);
  __n = ((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start) * 2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88,__n,(allocator_type *)&local_70);
  local_98 = input_name;
  lVar5 = std::chrono::_V2::system_clock::now();
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = ans_int_compress(local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,__n,puVar1,
                                (long)(input->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >>
                                2);
  lVar6 = std::chrono::_V2::system_clock::now();
  puVar2 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f0,__new_size);
  local_a0 = pVar11.second;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_d8,
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_70);
  lVar7 = std::chrono::_V2::system_clock::now();
  auVar9._8_56_ = extraout_var;
  auVar9._0_8_ = extraout_XMM1_Qa;
  auVar8 = auVar9._0_16_;
  ans_int_decompress(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2,
                     local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_f0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_f0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  auVar4 = vcvtusi2sd_avx512f(auVar8,lVar6 - lVar5);
  local_b0 = auVar4._0_8_;
  auVar4 = vcvtusi2sd_avx512f(auVar8,(long)puVar2 - (long)puVar3 >> 2);
  local_a8 = auVar4._0_8_;
  lVar5 = std::chrono::_V2::system_clock::now();
  auVar10._8_56_ = extraout_var_00;
  auVar10._0_8_ = extraout_XMM1_Qa_00;
  puVar1 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  n = (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  auVar4 = vcvtusi2sd_avx512f(auVar10._0_16_,lVar5 - lVar7);
  local_b8 = auVar4._0_8_;
  auVar4 = vcvtusi2sd_avx512f(auVar10._0_16_,n);
  local_c0 = auVar4._0_8_;
  local_50.field_2._M_allocated_capacity._0_4_ = 0x534e41;
  local_50._M_string_length = 3;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  REQUIRE_EQUAL(puVar1,local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,n,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                             local_50.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_60 = 0x534e41;
  local_68 = 3;
  auVar4 = vcvtusi2sd_avx512f(in_XMM4,__new_size << 3);
  local_70 = &local_60;
  printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%2.3f\t\t\n",local_90,
         auVar4._0_8_ / local_a8,local_b0 / local_a8,local_b8 / local_c0,
         (local_98->_M_dataplus)._M_p,
         (ulong)((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start) >> 2,local_a0,&local_60);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT44(uStack_5c,local_60) + 1);
  }
  fflush(_stdout);
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void run(std::vector<uint32_t>& input, std::string input_name)
{
    // (0) compute entropy
    auto [input_entropy, sigma] = compute_entropy(input);

    // (1) encode
    std::vector<uint8_t> encoded_data(input.size() * 8);
    std::vector<uint8_t> tmp_buf(input.size() * 8);

    size_t encoded_bytes;
    size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_encode = std::chrono::high_resolution_clock::now();
        encoded_bytes = t_compressor::encode(input.data(), input.size(),
            encoded_data.data(), encoded_data.size(), tmp_buf.data());
        auto stop_encode = std::chrono::high_resolution_clock::now();
        auto encoding_time_ns = stop_encode - start_encode;
        encoding_time_ns_min
            = std::min((size_t)encoding_time_ns.count(), encoding_time_ns_min);
    }

    double BPI = double(encoded_bytes * 8) / double(input.size());
    double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);
    double enc_ns_per_int = double(encoding_time_ns_min) / double(input.size());

    // (2) decode
    encoded_data.resize(encoded_bytes);
    std::vector<uint32_t> recover(input.size());
    size_t decode_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_decode = std::chrono::high_resolution_clock::now();
        t_compressor::decode(encoded_data.data(), encoded_data.size(),
            recover.data(), recover.size(), tmp_buf.data());
        auto stop_decode = std::chrono::high_resolution_clock::now();
        auto decode_time_ns = stop_decode - start_decode;
        decode_time_ns_min
            = std::min((size_t)decode_time_ns.count(), decode_time_ns_min);
    }
    double decode_IPS = compute_ips(input.size(), decode_time_ns_min);
    double dec_ns_per_int = double(decode_time_ns_min) / double(input.size());

    // (3) verify
    REQUIRE_EQUAL(
        input.data(), recover.data(), input.size(), t_compressor::name());

    // (4) output stats
    printf("%25.25s\t\t%15u\t\t%15u\t\t%18.18s\t\t%2.4f\t\t%2.4f\t\t%2.3f\t\t%"
           "2.3f\t\t\n",
        input_name.c_str(), (uint32_t)input.size(), (uint32_t)sigma,
        t_compressor::name().c_str(), input_entropy, BPI, enc_ns_per_int,
        dec_ns_per_int);
    fflush(stdout);
}